

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O1

bool __thiscall GetNameTest::DoTest(GetNameTest *this)

{
  size_t sVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  DnsStats *this_00;
  ulong uVar6;
  char **ppcVar7;
  bool bVar8;
  size_t name_length;
  char name_out [1024];
  size_t local_440;
  uint8_t local_438 [1032];
  
  pFVar4 = ithi_file_open("getname-out.txt","w");
  this->test_out = pFVar4;
  bVar8 = pFVar4 != (FILE *)0x0;
  if (bVar8) {
    ppcVar7 = &getNameTestData[0].expected;
    uVar6 = 0;
    do {
      local_440 = 0;
      sVar1 = (size_t)ppcVar7[-1];
      iVar3 = DnsStats::GetDnsName
                        (((st_getNameTestLine *)(ppcVar7 + -2))->dns,(uint32_t)sVar1,0,local_438,
                         0x400,&local_440);
      bVar2 = false;
      if (sVar1 == (long)iVar3) {
        __s = *ppcVar7;
        sVar5 = strlen(__s);
        if (sVar5 == local_440) {
          iVar3 = bcmp(__s,local_438,local_440);
          bVar2 = bVar8;
          if (iVar3 != 0) {
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
      }
      bVar8 = bVar2;
      if (7 < uVar6) break;
      uVar6 = uVar6 + 1;
      ppcVar7 = ppcVar7 + 3;
    } while (bVar8 != false);
  }
  if (bVar8 != false) {
    this_00 = (DnsStats *)operator_new(0x1e0);
    DnsStats::DnsStats(this_00);
    this->stats = this_00;
    if (bVar8 != false) {
      bVar8 = LoadPcapFile(this,"data/tiny-capture.pcap");
    }
  }
  if ((FILE *)this->test_out != (FILE *)0x0) {
    fclose((FILE *)this->test_out);
    this->test_out = (FILE *)0x0;
  }
  if (bVar8 != false) {
    bVar8 = MetricTest::compare_files("getname-out.txt","data/getname-test.txt");
  }
  return bVar8;
}

Assistant:

bool GetNameTest::DoTest()
{
    bool ret = true;

    test_out = ithi_file_open(getname_test_debug, "w");
    ret = (test_out != NULL);

    for (size_t i = 0; ret && i < sizeof(getNameTestData) / sizeof(struct st_getNameTestLine); i++) {
        char name_out[1024];
        size_t name_length = 0;
        size_t next = 0;

        next = DnsStats::GetDnsName(getNameTestData[i].dns, (uint32_t)getNameTestData[i].dns_length, 0, (uint8_t *)name_out, sizeof(name_out), &name_length);

        if (next != getNameTestData[i].dns_length) {
            ret = false;
        } else  if (strlen(getNameTestData[i].expected) != name_length) {
            ret = false;
        } else if (memcmp(getNameTestData[i].expected, name_out, name_length) != 0) {
            ret = false;
        }
    }


    if (ret) {
        stats = new DnsStats();

        if (stats == NULL) {
            ret = false;
        }
    }

    if (ret) {
        ret = LoadPcapFile(getname_input_test);
    }

    if (test_out != NULL) {
        fclose(test_out);
        test_out = NULL;
    }

    if (ret) {
        ret = MetricTest::compare_files(getname_test_debug, getname_test_output);
    }

    return ret;
}